

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O1

int testEqual(BDD a,BDD b)

{
  if (a == b) {
    return 1;
  }
  if (a == 0xffffffffffffffff) {
    testEqual_cold_3();
  }
  else if (b == 0xffffffffffffffff) {
    testEqual_cold_2();
  }
  else {
    testEqual_cold_1();
  }
  return 0;
}

Assistant:

int testEqual(BDD a, BDD b)
{
    if (a == b) return 1;

    if (a == sylvan_invalid) {
        fprintf(stderr, "a is invalid!\n");
        return 0;
    }

    if (b == sylvan_invalid) {
        fprintf(stderr, "b is invalid!\n");
        return 0;
    }

    fprintf(stderr, "a and b are not equal!\n");

    sylvan_fprint(stderr, a);fprintf(stderr, "\n");
    sylvan_fprint(stderr, b);fprintf(stderr, "\n");

    return 0;
}